

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O3

sz_ssize_t __thiscall sznet::net::Buffer::readFd(Buffer *this,sz_sock fd,int *savedErrno)

{
  size_t sVar1;
  int iVar2;
  sz_ssize_t sVar3;
  pointer pcVar4;
  size_t sVar5;
  
  pcVar4 = (this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  sVar5 = this->m_writerIndex;
  if ((long)this->m_wrapSize <= (long)sVar5) {
    sVar1 = this->m_readerIndex;
    if (sVar1 != this->m_nCheapPrepend) {
      memmove(pcVar4 + this->m_nCheapPrepend,pcVar4 + sVar1,sVar5 - sVar1);
      pcVar4 = (this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
      sVar5 = (sVar5 - sVar1) + this->m_nCheapPrepend;
      this->m_readerIndex = this->m_nCheapPrepend;
      this->m_writerIndex = sVar5;
    }
  }
  sVar3 = sockets::sz_read(fd,pcVar4 + sVar5,
                           *(int *)&(this->m_buffer).super__Vector_base<char,_std::allocator<char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                           ((int)sVar5 + (int)pcVar4));
  if (sVar3 < 0) {
    iVar2 = sz_getlasterr();
    *savedErrno = iVar2;
  }
  else {
    this->m_writerIndex = this->m_writerIndex + sVar3;
  }
  return sVar3;
}

Assistant:

sz_ssize_t Buffer::readFd(sockets::sz_sock fd, int* savedErrno)
{
	// �ж��Ƿ���Ҫ�ص�
	if ((begin() + m_writerIndex) >= (begin() + m_wrapSize))
	{
		wrapBuffer();
	}

	char* buf = (begin() + m_writerIndex);
	const size_t writable = writableBytes();
	const sz_ssize_t n = sockets::sz_read(fd, buf, static_cast<int>(writable));
	if (n < 0)
	{
		*savedErrno = sz_getlasterr();
	}
	else
	{
		m_writerIndex += n;
	}
	
	return n;
}